

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::setActive(QUndoStack *this,bool active)

{
  QUndoStackPrivate *this_00;
  QUndoStack *pQVar1;
  byte in_SIL;
  QUndoGroup *in_RDI;
  QUndoStackPrivate *d;
  
  this_00 = d_func((QUndoStack *)0xa84345);
  if (this_00->group != (QUndoGroup *)0x0) {
    if ((in_SIL & 1) == 0) {
      pQVar1 = QUndoGroup::activeStack(in_RDI);
      if (pQVar1 == (QUndoStack *)in_RDI) {
        QUndoGroup::setActiveStack((QUndoGroup *)this_00,(QUndoStack *)in_RDI);
      }
    }
    else {
      QUndoGroup::setActiveStack((QUndoGroup *)this_00,(QUndoStack *)in_RDI);
    }
  }
  return;
}

Assistant:

void QUndoStack::setActive(bool active)
{
#if !QT_CONFIG(undogroup)
    Q_UNUSED(active);
#else
    Q_D(QUndoStack);

    if (d->group != nullptr) {
        if (active)
            d->group->setActiveStack(this);
        else if (d->group->activeStack() == this)
            d->group->setActiveStack(nullptr);
    }
#endif
}